

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O2

void __thiscall FunctionDeclarationNode::~FunctionDeclarationNode(FunctionDeclarationNode *this)

{
  (this->super_StatementNode).super_Node._vptr_Node =
       (_func_int **)&PTR__FunctionDeclarationNode_001d1018;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  ::_M_clear(&(this->arguments_).
              super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
            );
  std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

FunctionDeclarationNode(const std::string& name, const TypeName& returnType, 
    const std::list<std::pair<std::string, TypeName>> args, std::unique_ptr<BlockNode> body):
      name_(name), returnType_(returnType), arguments_(args), body_(std::move(body)) {}